

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_php_sets_b_flag_Test::CpuTest_php_sets_b_flag_Test
          (CpuTest_php_sets_b_flag_Test *this)

{
  CpuTest_php_sets_b_flag_Test *this_local;
  
  n_e_s::core::test::CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test =
       (_func_int **)&PTR__CpuTest_php_sets_b_flag_Test_003e7298;
  return;
}

Assistant:

TEST_F(CpuTest, php_sets_b_flag) {
    stage_instruction(PHP);
    registers.sp = 0x0A;
    registers.p = N_FLAG | Z_FLAG;

    expected.sp = 0x09;
    expected.p = registers.p;

    // Dummy read
    EXPECT_CALL(mmu, read_byte(expected.pc));
    EXPECT_CALL(
            mmu, write_byte(kStackOffset + registers.sp, registers.p | B_FLAG));

    step_execution(3);
    EXPECT_EQ(expected, registers);
}